

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

SyntaxNode * __thiscall slang::parsing::Parser::parseForInitializer(Parser *this)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  DataTypeSyntax *type;
  DeclaratorSyntax *pDVar3;
  ForVariableDeclarationSyntax *pFVar4;
  Token varKeyword;
  Token local_30;
  
  bVar2 = isVariableDeclaration(this);
  if (bVar2) {
    varKeyword = ParserBase::consumeIf(&this->super_ParserBase,VarKeyword);
    type = parseDataType(this,(bitmask<slang::parsing::detail::TypeOptions>)0x0);
    pDVar3 = parseDeclarator(this,false,true);
    pFVar4 = slang::syntax::SyntaxFactory::forVariableDeclaration
                       (&this->factory,varKeyword,type,pDVar3);
    pSVar1 = this->previewNode;
    this->previewNode = (SyntaxNode *)0x0;
    (pFVar4->super_SyntaxNode).previewNode = pSVar1;
  }
  else {
    Token::Token(&local_30);
    pDVar3 = parseDeclarator(this,false,false);
    pFVar4 = slang::syntax::SyntaxFactory::forVariableDeclaration
                       (&this->factory,local_30,(DataTypeSyntax *)0x0,pDVar3);
  }
  return &pFVar4->super_SyntaxNode;
}

Assistant:

SyntaxNode& Parser::parseForInitializer() {
    if (isVariableDeclaration()) {
        auto varKeyword = consumeIf(TokenKind::VarKeyword);
        auto& type = parseDataType();
        auto& decl = parseDeclarator(/* allowMinTypMax */ false,
                                     /* requireInitializers */ true);
        auto& result = factory.forVariableDeclaration(varKeyword, &type, decl);
        result.previewNode = std::exchange(previewNode, nullptr);
        return result;
    }

    return factory.forVariableDeclaration(Token(), nullptr, parseDeclarator());
}